

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testValid_1InferenceAnd3TrainingInputs(void)

{
  NeuralNetwork *this;
  NetworkUpdateParameters *pNVar1;
  LossLayer *this_00;
  CategoricalCrossEntropyLossLayer *this_01;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  FeatureDescription *this_02;
  ostream *poVar6;
  int iVar7;
  bool bVar8;
  Model spec;
  string softmaxOutputName;
  undefined1 local_158 [40];
  string targetName;
  Result res;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_b8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_88;
  TensorAttributes tensorAttributesOut;
  TensorAttributes tensorAttributesIn;
  
  CoreML::Specification::Model::Model(&spec);
  CoreML::Result::Result(&res);
  tensorAttributesIn.name = "InTensor";
  tensorAttributesIn.dimension = 3;
  tensorAttributesIn._12_4_ = 0;
  tensorAttributesOut.name = "OutTensor";
  tensorAttributesOut.dimension = 1;
  tensorAttributesOut._12_4_ = 0;
  buildBasicNeuralNetworkModel
            (&spec,true,&tensorAttributesIn,&tensorAttributesOut,0x400,false,false);
  spec.specificationversion_ = 4;
  this = CoreML::Specification::Model::mutable_neuralnetwork(&spec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&softmaxOutputName,"softmax_out",(allocator<char> *)local_158);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&targetName,"cce_target",(allocator<char> *)local_158);
  addSoftmaxLayer(&spec,"softmax","OutTensor",softmaxOutputName._M_dataplus._M_p);
  pNVar1 = CoreML::Specification::NeuralNetwork::mutable_updateparams(this);
  this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::Add
                      (&pNVar1->losslayers_);
  CoreML::Specification::LossLayer::set_name(this_00,"cross_entropy_loss_layer");
  this_01 = CoreML::Specification::LossLayer::mutable_categoricalcrossentropylosslayer(this_00);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_input(this_01,&softmaxOutputName);
  CoreML::Specification::CategoricalCrossEntropyLossLayer::set_target(this_01,&targetName);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (this,kSgdOptimizer,0.699999988079071,0.0,1.0);
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>
            (this,kSgdOptimizer,10,5,100,
             (set<long,_std::less<long>,_std::allocator<long>_> *)&local_88);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_88);
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl._0_8_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  addEpochs<CoreML::Specification::NeuralNetwork>
            (this,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_b8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_b8);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  addShuffleAndSeed<CoreML::Specification::NeuralNetwork>
            (this,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_e8);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_e8);
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"madeUpInput");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  iVar7 = 3;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  this_02 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                      (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(this_02,"madeUpInput2");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x10020;
  iVar7 = 3;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  }
  pMVar2 = CoreML::Specification::Model::mutable_description(&spec);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->traininginput_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,(this_01->target_).ptr_);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pAVar5->datatype_ = 0x20020;
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  CoreML::Model::validate((Result *)local_158,&spec);
  CoreML::Result::operator=(&res,(Result *)local_158);
  std::__cxx11::string::~string((string *)(local_158 + 8));
  bVar8 = CoreML::Result::good(&res);
  if (!bVar8) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x876);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"(res).good()");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&targetName);
  std::__cxx11::string::~string((string *)&softmaxOutputName);
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&spec);
  return (uint)!bVar8;
}

Assistant:

int testValid_1InferenceAnd3TrainingInputs() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };
    TensorAttributes tensorAttributesOut = { "OutTensor", 1 };

    (void)buildBasicNeuralNetworkModel(spec, true, &tensorAttributesIn, &tensorAttributesOut, 1024);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    auto neuralNet = spec.mutable_neuralnetwork();

    // set a softmax layer
    std::string softmaxOutputName = "softmax_out";
    std::string targetName = "cce_target";
    (void)addSoftmaxLayer(spec, "softmax", "OutTensor", softmaxOutputName.c_str());

    Specification::NetworkUpdateParameters *updateParams = neuralNet->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name("cross_entropy_loss_layer");
    Specification::CategoricalCrossEntropyLossLayer *ceLossLayer = lossLayer->mutable_categoricalcrossentropylosslayer();
    ceLossLayer->set_input(softmaxOutputName);
    ceLossLayer->set_target(targetName);

    addLearningRate(neuralNet, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(neuralNet, Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(neuralNet, 100, 1, 100, std::set<int64_t>());
    addShuffleAndSeed(neuralNet, 2019, 0, 2019, std::set<int64_t>());

    auto fakeModelInput = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput->set_name("madeUpInput");
    auto fakeModelInputShape = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape->add_shape(1);
    }
    auto fakeModelInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    fakeModelInput2->set_name("madeUpInput2");
    auto fakeModelInputShape2 = fakeModelInput->mutable_type()->mutable_multiarraytype();
    fakeModelInputShape2->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < 3; i++) {
        fakeModelInputShape2->add_shape(1);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput->set_name(ceLossLayer->target());
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}